

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

void dxil_spv_parsed_blob_get_rdat_subobject
               (dxil_spv_parsed_blob blob,uint index,dxil_spv_rdat_subobject *subobject)

{
  reference pvVar1;
  char **ppcVar2;
  size_type sVar3;
  value_type *sub;
  dxil_spv_rdat_subobject *subobject_local;
  uint index_local;
  dxil_spv_parsed_blob blob_local;
  
  pvVar1 = std::
           vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
           ::operator[](&blob->rdat_subobjects,(ulong)index);
  subobject->kind = pvVar1->kind;
  subobject->subobject_name = pvVar1->subobject_name;
  ppcVar2 = std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::data
                      (&pvVar1->exports);
  subobject->exports = ppcVar2;
  sVar3 = std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::size
                    (&pvVar1->exports);
  subobject->num_exports = (uint)sVar3;
  subobject->payload = pvVar1->payload;
  subobject->payload_size = pvVar1->payload_size;
  subobject->hit_group_type = pvVar1->hit_group_type;
  *(undefined8 *)subobject->args = *(undefined8 *)pvVar1->args;
  return;
}

Assistant:

void dxil_spv_parsed_blob_get_rdat_subobject(
		dxil_spv_parsed_blob blob, unsigned index, dxil_spv_rdat_subobject *subobject)
{
	auto &sub = blob->rdat_subobjects[index];
	subobject->kind = static_cast<dxil_spv_rdat_subobject_kind>(sub.kind);
	subobject->subobject_name = sub.subobject_name;
	subobject->exports = sub.exports.data();
	subobject->num_exports = unsigned(sub.exports.size());
	subobject->payload = sub.payload;
	subobject->payload_size = sub.payload_size;
	subobject->hit_group_type = static_cast<dxil_spv_hit_group_type>(sub.hit_group_type);
	static_assert(sizeof(subobject->args) == sizeof(sub.args), "Mismatch is args size.");
	memcpy(subobject->args, sub.args, sizeof(sub.args));
}